

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncasecmp.c
# Opt level: O1

int nn_strncasecmp(char *a,char *b,size_t len)

{
  char cVar1;
  int iVar2;
  __int32_t **pp_Var3;
  size_t sVar4;
  
  if (len == 0) {
    return 0;
  }
  sVar4 = 0;
  do {
    cVar1 = a[sVar4];
    if (((long)cVar1 == 0) && (b[sVar4] == '\0')) {
      return 0;
    }
    pp_Var3 = __ctype_tolower_loc();
    iVar2 = (*pp_Var3)[cVar1] - (*pp_Var3)[b[sVar4]];
    if (iVar2 != 0) {
      return iVar2;
    }
    sVar4 = sVar4 + 1;
  } while (len != sVar4);
  return 0;
}

Assistant:

int
nn_strncasecmp(const char *a, const char *b, size_t len)
{
	int rv;
	size_t count;
	for (count = 0; count < len; count++) {
		if ((*a == 0) && (*b == 0)) {
			return (0);
		}
		if ((rv = tolower(*a) - tolower(*b)) != 0) {
			return (rv);
		}
		a++;
		b++;
	}
	return (0);
}